

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  bool bVar1;
  char *str_00;
  Message *pMVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28;
  
  bVar1 = false;
  local_28 = flag;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&local_30);
    pMVar2 = Message::operator<<((Message *)&local_30,(char (*) [21])"The value of flag --");
    pMVar2 = Message::operator<<(pMVar2,&local_28);
    bVar1 = ParseInt32(pMVar2,str_00,value);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}